

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonotope.cpp
# Opt level: O2

uint readFile(char *filename,
             vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             *star)

{
  value_type vVar1;
  bool bVar2;
  char cVar3;
  istream *piVar4;
  reference pvVar5;
  Scalar *pSVar6;
  ulong uVar7;
  uint uVar8;
  size_type __n;
  string linestr;
  VectorXd v;
  vector<double,_std::allocator<double>_> line;
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_3e8;
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_3d0;
  ifstream input;
  istringstream buffer;
  
  std::ifstream::ifstream(&input,filename,_S_in);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    uVar8 = 0;
    printf("Could not open or find file: %s\n",filename);
  }
  else {
    linestr._M_dataplus._M_p = (pointer)&linestr.field_2;
    linestr._M_string_length = 0;
    linestr.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&input,(string *)&linestr);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&input,(string *)&linestr);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&input,(string *)&linestr);
    uVar8 = 0;
    do {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&input,(string *)&linestr);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
        std::ifstream::close();
        goto LAB_0011330e;
      }
      std::__cxx11::istringstream::istringstream((istringstream *)&buffer,(string *)&linestr,_S_in);
      std::istream_iterator<double,_char,_std::char_traits<char>,_long>::istream_iterator
                (&local_3d0,(istream_type *)&buffer);
      local_3e8._M_stream = (istream_type *)0x0;
      local_3e8._M_value = 0.0;
      local_3e8._M_ok = false;
      std::vector<double,std::allocator<double>>::
      vector<std::istream_iterator<double,char,std::char_traits<char>,long>,void>
                ((vector<double,std::allocator<double>> *)&line,&local_3d0,&local_3e8,
                 (allocator_type *)&v);
      if (((long)line.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)line.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start == 0) ||
         (uVar7 = (long)line.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)line.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3, uVar7 != uVar8 && uVar8 != 0)) {
        puts("Malformed input file");
        std::ifstream::close();
        bVar2 = false;
      }
      else {
        uVar8 = (uint)uVar7;
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
                  ((Matrix<double,__1,_1,_0,__1,_1> *)&v,uVar7 & 0xffffffff);
        for (__n = 0; (uVar7 & 0xffffffff) != __n; __n = __n + 1) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::at(&line,__n);
          vVar1 = *pvVar5;
          pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&v,__n);
          *pSVar6 = vVar1;
        }
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::push_back(star,(value_type *)&v);
        free(v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
        bVar2 = true;
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&line);
      std::__cxx11::istringstream::~istringstream((istringstream *)&buffer);
    } while (bVar2);
    uVar8 = 0;
LAB_0011330e:
    std::__cxx11::string::~string((string *)&linestr);
  }
  std::ifstream::~ifstream(&input);
  return uVar8;
}

Assistant:

unsigned int readFile(const char *filename, std::vector<Eigen::VectorXd> &star) {
	std::ifstream input(filename);

	if (!input.is_open()) {
		printf("Could not open or find file: %s\n", filename);
		return 0;
	}

	std::string linestr;
	unsigned int dim = 0;

	// skipping first 3 lines
	std::getline(input, linestr);
	std::getline(input, linestr);
	std::getline(input, linestr);

	while (std::getline(input, linestr)) {
		std::istringstream buffer(linestr);
		std::vector<double> line((std::istream_iterator<double>(buffer)), std::istream_iterator<double>());

		if ((line.size() < 1) || (dim && dim != line.size())) {
			printf("Malformed input file\n");
			input.close();
			return 0;
		}

		dim = (unsigned int)(line.size());
		Eigen::VectorXd v(dim);

		for (unsigned int i = 0; i < dim; i++)
			v[i] = line.at(i);

		star.push_back(v);
	}

	input.close();

	return dim;
}